

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::getCEsFromContractionCE32
          (CollationFastLatinBuilder *this,CollationData *data,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  char16_t c;
  int32_t iVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int32_t iVar6;
  UnicodeString *this_00;
  int32_t x;
  UnicodeString *suffix;
  ConstChar16Ptr local_c8;
  undefined1 local_c0 [8];
  Iterator suffixes;
  int local_40;
  UBool addContraction;
  int32_t prevX;
  int32_t contractionIndex;
  UChar *p;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  CollationData *data_local;
  CollationFastLatinBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    pUVar1 = data->contexts;
    iVar3 = Collation::indexFromCE32(ce32);
    uVar4 = CollationData::readCE32(pUVar1 + iVar3);
    iVar5 = UVector64::size(&this->contractionCEs);
    UVar2 = getCEsFromCE32(this,data,-1,uVar4,errorCode);
    if (UVar2 == '\0') {
      addContractionEntry(this,0x1ff,0x101000100,0,errorCode);
    }
    else {
      addContractionEntry(this,0x1ff,this->ce0,this->ce1,errorCode);
    }
    local_40 = -1;
    suffixes.stack_._7_1_ = '\0';
    ConstChar16Ptr::ConstChar16Ptr(&local_c8,pUVar1 + iVar3 + 2);
    UCharsTrie::Iterator::Iterator((Iterator *)local_c0,&local_c8,0,errorCode);
    ConstChar16Ptr::~ConstChar16Ptr(&local_c8);
    while (UVar2 = UCharsTrie::Iterator::next((Iterator *)local_c0,errorCode), UVar2 != '\0') {
      this_00 = UCharsTrie::Iterator::getString((Iterator *)local_c0);
      c = UnicodeString::charAt(this_00,0);
      iVar3 = CollationFastLatin::getCharIndex(c);
      if (-1 < iVar3) {
        if (iVar3 == local_40) {
          if (suffixes.stack_._7_1_ != '\0') {
            addContractionEntry(this,iVar3,0x101000100,0,errorCode);
            suffixes.stack_._7_1_ = '\0';
          }
        }
        else {
          if (suffixes.stack_._7_1_ != '\0') {
            addContractionEntry(this,local_40,this->ce0,this->ce1,errorCode);
          }
          uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_c0);
          iVar6 = UnicodeString::length(this_00);
          local_40 = iVar3;
          if ((iVar6 == 1) && (UVar2 = getCEsFromCE32(this,data,-1,uVar4,errorCode), UVar2 != '\0'))
          {
            suffixes.stack_._7_1_ = '\x01';
          }
          else {
            addContractionEntry(this,iVar3,0x101000100,0,errorCode);
            suffixes.stack_._7_1_ = '\0';
          }
        }
      }
    }
    if (suffixes.stack_._7_1_ != '\0') {
      addContractionEntry(this,local_40,this->ce0,this->ce1,errorCode);
    }
    UVar2 = ::U_FAILURE(*errorCode);
    this_local._7_1_ = UVar2 == '\0';
    if (this_local._7_1_) {
      this->ce0 = (long)iVar5 | 0x180000000;
      this->ce1 = 0;
    }
    UCharsTrie::Iterator::~Iterator((Iterator *)local_c0);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::getCEsFromContractionCE32(const CollationData &data, uint32_t ce32,
                                                     UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    const UChar *p = data.contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no suffix match.
    // Since the original ce32 is not a prefix mapping,
    // the default ce32 must not be another contraction.
    U_ASSERT(!Collation::isContractionCE32(ce32));
    int32_t contractionIndex = contractionCEs.size();
    if(getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, ce0, ce1, errorCode);
    } else {
        // Bail out for c-without-contraction.
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, Collation::NO_CE, 0, errorCode);
    }
    // Handle an encodable contraction unless the next contraction is too long
    // and starts with the same character.
    int32_t prevX = -1;
    UBool addContraction = FALSE;
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        const UnicodeString &suffix = suffixes.getString();
        int32_t x = CollationFastLatin::getCharIndex(suffix.charAt(0));
        if(x < 0) { continue; }  // ignore anything but fast Latin text
        if(x == prevX) {
            if(addContraction) {
                // Bail out for all contractions starting with this character.
                addContractionEntry(x, Collation::NO_CE, 0, errorCode);
                addContraction = FALSE;
            }
            continue;
        }
        if(addContraction) {
            addContractionEntry(prevX, ce0, ce1, errorCode);
        }
        ce32 = (uint32_t)suffixes.getValue();
        if(suffix.length() == 1 && getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
            addContraction = TRUE;
        } else {
            addContractionEntry(x, Collation::NO_CE, 0, errorCode);
            addContraction = FALSE;
        }
        prevX = x;
    }
    if(addContraction) {
        addContractionEntry(prevX, ce0, ce1, errorCode);
    }
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Note: There might not be any fast Latin contractions, but
    // we need to enter contraction handling anyway so that we can bail out
    // when there is a non-fast-Latin character following.
    // For example: Danish &Y<<u+umlaut, when we compare Y vs. u\u0308 we need to see the
    // following umlaut and bail out, rather than return the difference of Y vs. u.
    ce0 = ((int64_t)Collation::NO_CE_PRIMARY << 32) | CONTRACTION_FLAG | contractionIndex;
    ce1 = 0;
    return TRUE;
}